

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

Kit_DsdNtk_t * Kit_DsdShrink(Kit_DsdNtk_t *p,int *pPrios)

{
  unsigned_short uVar1;
  int iVar2;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x666,"Kit_DsdNtk_t *Kit_DsdShrink(Kit_DsdNtk_t *, int *)");
  }
  pNtk = Kit_DsdNtkAlloc((uint)p->nVars);
  uVar4 = (uint)(p->Root >> 1);
  if ((uint)p->nNodes + (uint)p->nVars <= uVar4) {
LAB_0055b217:
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  uVar4 = (uint)*p->pNodes[(ulong)uVar4 - (ulong)p->nVars] & 0x1c0;
  if (uVar4 == 0x80) {
    pKVar3 = Kit_DsdObjAlloc(pNtk,KIT_DSD_VAR,1);
    uVar4 = (uint)(p->Root >> 1);
    if ((uint)p->nNodes + (uint)p->nVars <= uVar4) goto LAB_0055b217;
    *(undefined2 *)(pKVar3 + 1) = *(undefined2 *)(p->pNodes[(ulong)uVar4 - (ulong)p->nVars] + 1);
  }
  else {
    if (uVar4 != 0x40) {
      iVar2 = Kit_DsdShrink_rec(pNtk,p,(uint)p->Root,pPrios);
      uVar1 = (unsigned_short)iVar2;
      goto LAB_0055b20a;
    }
    pKVar3 = Kit_DsdObjAlloc(pNtk,KIT_DSD_CONST1,0);
  }
  uVar1 = (p->Root & 1) + (SUB42(*pKVar3,0) & 0x3f) * 2;
LAB_0055b20a:
  pNtk->Root = uVar1;
  return pNtk;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdShrink( Kit_DsdNtk_t * p, int pPrios[] )
{
    Kit_DsdNtk_t * pNew;
    Kit_DsdObj_t * pObjNew;
    assert( p->nVars <= 16 );
    // create a new network
    pNew = Kit_DsdNtkAlloc( p->nVars );
    // consider simple special cases
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_CONST1, 0 );
        pNew->Root = Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(p->Root) );
        return pNew;
    }
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_VAR, 1 );
        pObjNew->pFans[0] = Kit_DsdNtkRoot(p)->pFans[0];
        pNew->Root = Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(p->Root) );
        return pNew;
    }
    // convert the root node
    pNew->Root = Kit_DsdShrink_rec( pNew, p, p->Root, pPrios );
    return pNew;
}